

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  ZSTD_customMem customMem;
  long in_RDI;
  ZSTD_cwksp *unaff_retaddr;
  undefined8 uStack0000000000000010;
  undefined8 uStack0000000000000018;
  ZSTDMT_CCtx *in_stack_ffffffffffffffe8;
  ZSTD_CCtx *in_stack_fffffffffffffff0;
  
  if (in_RDI == 0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5163,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
  }
  if (*(long *)(in_RDI + 0x370) == 0) {
    ZSTD_clearAllDicts(in_stack_fffffffffffffff0);
    ZSTDMT_freeCCtx(in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0xe78) = 0;
    customMem.opaque = cctx;
    customMem.customAlloc = (ZSTD_allocFunction)uStack0000000000000010;
    customMem.customFree = (ZSTD_freeFunction)uStack0000000000000018;
    ZSTD_cwksp_free(unaff_retaddr,customMem);
    return;
  }
  __assert_fail("cctx->staticSize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5164,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}